

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool
add_item_to_object(cJSON *object,char *string,cJSON *item,internal_hooks *hooks,
                  cJSON_bool constant_key)

{
  cJSON *pcVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  cJSON *pcVar4;
  uint uVar5;
  cJSON_bool cVar6;
  
  cVar6 = 0;
  if (item != (cJSON *)0x0 && (string != (char *)0x0 && object != (cJSON *)0x0)) {
    if ((int)hooks == 0) {
      sVar3 = strlen(string);
      __dest = (char *)(*global_hooks.allocate)(sVar3 + 1);
      if (__dest == (char *)0x0) {
        return 0;
      }
      memcpy(__dest,string,sVar3 + 1);
      uVar2 = item->type;
      uVar5 = uVar2 & 0xfffffdff;
    }
    else {
      uVar2 = item->type;
      uVar5 = uVar2 | 0x200;
      __dest = string;
    }
    if (((uVar2 >> 9 & 1) == 0) && (item->string != (char *)0x0)) {
      (*global_hooks.deallocate)(item->string);
    }
    item->string = __dest;
    item->type = uVar5;
    pcVar1 = object->child;
    if (object->child == (cJSON *)0x0) {
      object->child = item;
    }
    else {
      do {
        pcVar4 = pcVar1;
        pcVar1 = pcVar4->next;
      } while (pcVar4->next != (cJSON *)0x0);
      pcVar4->next = item;
      item->prev = pcVar4;
    }
    cVar6 = 1;
  }
  return cVar6;
}

Assistant:

static cJSON_bool add_item_to_object(cJSON * const object, const char * const string, cJSON * const item, const internal_hooks * const hooks, const cJSON_bool constant_key)
{
    char *new_key = NULL;
    int new_type = cJSON_Invalid;

    if ((object == NULL) || (string == NULL) || (item == NULL))
    {
        return false;
    }

    if (constant_key)
    {
        new_key = (char*)cast_away_const(string);
        new_type = item->type | cJSON_StringIsConst;
    }
    else
    {
        new_key = (char*)cJSON_strdup((const unsigned char*)string, hooks);
        if (new_key == NULL)
        {
            return false;
        }

        new_type = item->type & ~cJSON_StringIsConst;
    }

    if (!(item->type & cJSON_StringIsConst) && (item->string != NULL))
    {
        hooks->deallocate(item->string);
    }

    item->string = new_key;
    item->type = new_type;

    return add_item_to_array(object, item);
}